

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadNodes<mapnode_t,mapsubsector_t>(MapData *map)

{
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  FileReader *pFVar4;
  FileReader *pFVar5;
  _func_int *p_Var6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [12];
  bool bVar10;
  node_t *pnVar11;
  uint uVar12;
  long lVar13;
  ushort *__s;
  uint uVar14;
  FString FVar15;
  ulong uVar16;
  long lVar17;
  anon_union_32_2_9298864e_for_node_t_4 *paVar18;
  FMemLump FVar19;
  bool bVar20;
  long lVar21;
  size_t __n;
  undefined1 auVar22 [16];
  undefined8 uStack_50;
  ushort auStack_48 [4];
  FMemLump local_40;
  FMemLump data;
  
  __s = auStack_48;
  uStack_50 = 0x569c21;
  FMemLump::FMemLump(&local_40);
  pFVar4 = map->MapLumps[7].Reader;
  uVar12 = 0;
  if (pFVar4 == (FileReader *)0x0) {
    FVar15.Chars = (char *)0x0;
  }
  else {
    FVar15.Chars = (char *)(long)(int)pFVar4->Length;
  }
  pFVar5 = map->MapLumps[6].Reader;
  if (pFVar5 != (FileReader *)0x0) {
    uVar12 = (uint)pFVar5->Length;
  }
  numnodes = (int)((ulong)FVar15.Chars / 0x1c);
  if ((uVar12 < 4) || (numnodes == 0 && uVar12 >> 2 != 1)) {
    ForceNodeBuild = true;
  }
  else {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)numnodes;
    uVar16 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x48),8) == 0) {
      uVar16 = SUB168(auVar7 * ZEXT816(0x48),0);
    }
    uStack_50 = 0x569ca3;
    data.Block.Chars = (FString)(FString)FVar15.Chars;
    nodes = (node_t *)operator_new__(uVar16);
    __n = (long)((ulong)FVar15.Chars / 0x1c << 0x20) >> 0x1f;
    lVar8 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = (ushort *)((long)auStack_48 + lVar8);
    *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569cd0;
    memset(__s,0,__n);
    FVar19 = data;
    *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569cd9;
    data.Block.Chars = (FString)operator_new__((ulong)FVar19.Block.Chars);
    lVar17 = pFVar4->Length;
    map->file = pFVar4;
    p_Var6 = (pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4];
    *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569cf7;
    (*p_Var6)(pFVar4,0,0);
    FVar19 = data;
    pFVar4 = map->file;
    p_Var6 = (pFVar4->super_FileReaderBase)._vptr_FileReaderBase[2];
    *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569d0b;
    (*p_Var6)(pFVar4,FVar19.Block.Chars,(long)(int)lVar17);
    if (0 < numnodes) {
      lVar17 = (long)data.Block.Chars + 8;
      paVar18 = &nodes->field_4;
      uVar16 = 0;
      pnVar11 = nodes;
      FVar19 = data;
      do {
        uVar1 = *(undefined8 *)FVar19.Block.Chars;
        auVar9._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar9._0_10_ = (unkuint10)0;
        auVar22._2_12_ =
             SUB1612(ZEXT616(CONCAT42(auVar9._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
        auVar22._0_2_ = (short)uVar1;
        auVar22._14_2_ = 0;
        auVar22 = auVar22 << 0x10;
        pnVar11->x = auVar22._0_4_;
        pnVar11->y = auVar22._4_4_;
        pnVar11->dx = auVar22._8_4_;
        pnVar11->dy = auVar22._12_4_;
        lVar21 = 0;
        bVar10 = true;
        do {
          bVar20 = bVar10;
          uVar2 = *(ushort *)((long)FVar19.Block.Chars + lVar21 * 2 + 0x18);
          uVar14 = (uint)uVar2;
          if (-1 < (short)uVar2) {
            if ((int)uVar14 < numnodes) {
              uVar3 = *(ushort *)((long)__s + (ulong)uVar14 * 2);
              if (uVar3 == 0) {
                *(ulong *)((long)&pnVar11->field_6 + lVar21 * 8) =
                     (long)&nodes->x + (ulong)(uVar14 * 0x48);
                *(short *)((long)__s + (ulong)uVar14 * 2) = (short)lVar21 + 1;
                goto LAB_00569db3;
              }
              *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569e59;
              Printf("BSP node %d references node %d,\nwhich is already used by node %d.\nThe BSP will be rebuilt.\n"
                     ,uVar16,(ulong)uVar2,(ulong)(uVar3 - 1));
            }
            else {
              lVar17 = *(long *)((long)&pnVar11->field_6 + lVar21 * 8);
              *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569e47;
              Printf("BSP node %d references invalid node %td.\nThe BSP will be rebuilt.\n",uVar16,
                     (lVar17 - (long)nodes >> 3) * -0x71c71c71c71c71c7);
            }
LAB_00569e69:
            ForceNodeBuild = true;
            if (nodes != (node_t *)0x0) {
              *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569e81;
              operator_delete__(nodes);
            }
            goto LAB_00569e81;
          }
          if (uVar12 >> 2 <= (uVar14 & 0x7fff)) {
            *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569e69;
            Printf("BSP node %d references invalid subsector %d.\nThe BSP will be rebuilt.\n");
            goto LAB_00569e69;
          }
          *(ulong *)((long)&pnVar11->field_6 + lVar21 * 8) =
               (long)subsectors->portalcoverage + ((ulong)((uVar14 & 0x7fff) * 0x60) - 0x3f);
LAB_00569db3:
          lVar13 = 0;
          do {
            *(float *)((long)paVar18 + lVar13 * 4 + lVar21 * 0x10) =
                 (float)(int)*(short *)(lVar17 + lVar21 * 8 + lVar13 * 2);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          lVar21 = 1;
          bVar10 = false;
        } while (bVar20);
        uVar14 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar14;
        pnVar11 = pnVar11 + 1;
        FVar19.Block.Chars = (FString)((long)FVar19.Block.Chars + 0x1c);
        lVar17 = lVar17 + 0x1c;
        paVar18 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar18 + 0x48);
      } while ((int)uVar14 < numnodes);
    }
LAB_00569e81:
    FVar19.Block.Chars = data.Block.Chars;
    *(undefined8 *)((long)auStack_48 + lVar8 + -8) = 0x569e8a;
    operator_delete__((void *)FVar19.Block.Chars);
  }
  *(undefined8 *)((long)__s + -8) = 0x569e93;
  FMemLump::~FMemLump(&local_40);
  return;
}

Assistant:

void P_LoadNodes (MapData * map)
{
	FMemLump	data;
	int 		i;
	int 		j;
	int 		k;
	char		*mnp;
	nodetype	*mn;
	node_t* 	no;
	WORD*		used;
	int			lumplen = map->Size(ML_NODES);
	int			maxss = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	numnodes = (lumplen - nodetype::NF_LUMPOFFSET) / sizeof(nodetype);

	if ((numnodes == 0 && maxss != 1) || maxss == 0)
	{
		ForceNodeBuild = true;
		return;
	}
	
	nodes = new node_t[numnodes];		
	used = (WORD *)alloca (sizeof(WORD)*numnodes);
	memset (used, 0, sizeof(WORD)*numnodes);

	mnp = new char[lumplen];
	mn = (nodetype*)(mnp + nodetype::NF_LUMPOFFSET);
	map->Read(ML_NODES, mnp);
	no = nodes;
	
	for (i = 0; i < numnodes; i++, no++, mn++)
	{
		no->x = LittleShort(mn->x)<<FRACBITS;
		no->y = LittleShort(mn->y)<<FRACBITS;
		no->dx = LittleShort(mn->dx)<<FRACBITS;
		no->dy = LittleShort(mn->dy)<<FRACBITS;
		for (j = 0; j < 2; j++)
		{
			int child = mn->Child(j);
			if (child & nodetype::NF_SUBSECTOR)
			{
				child &= ~nodetype::NF_SUBSECTOR;
				if (child >= maxss)
				{
					Printf ("BSP node %d references invalid subsector %d.\n"
						"The BSP will be rebuilt.\n", i, child);
					ForceNodeBuild = true;
					delete[] nodes;
					delete[] mnp;
					return;
				}
				no->children[j] = (BYTE *)&subsectors[child] + 1;
			}
			else if (child >= numnodes)
			{
				Printf ("BSP node %d references invalid node %td.\n"
					"The BSP will be rebuilt.\n", i, (node_t *)no->children[j] - nodes);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else if (used[child])
			{
				Printf ("BSP node %d references node %d,\n"
					"which is already used by node %d.\n"
					"The BSP will be rebuilt.\n", i, child, used[child]-1);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else
			{
				no->children[j] = &nodes[child];
				used[child] = j + 1;
			}
			for (k = 0; k < 4; k++)
			{
				no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
			}
		}
	}
	delete[] mnp;
}